

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

base_learner * Search::setup(options_i *options,vw *all)

{
  size_t *location;
  size_t *location_00;
  uint32_t *location_01;
  uint uVar1;
  search_private *psVar2;
  options_i *poVar3;
  search_task *psVar4;
  search_metatask *psVar5;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  typed_option<unsigned_long> *ptVar11;
  typed_option<float> *ptVar12;
  vw_exception *pvVar13;
  polylabel *ppVar14;
  undefined **ppuVar15;
  ostream *poVar16;
  typed_option<unsigned_int> *ptVar17;
  base_learner *base;
  clock_t cVar18;
  size_t sVar19;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar20;
  long lVar21;
  byte bVar22;
  vw *pvVar23;
  label_parser *plVar24;
  RollMethod RVar25;
  search_task **mytask_2;
  search_task **mytask;
  byte bVar26;
  float fVar27;
  string sStack_708;
  vw *local_6e8;
  allocator local_6dd;
  allocator local_6dc;
  allocator local_6db;
  allocator local_6da;
  allocator local_6d9;
  allocator local_6d8 [32];
  allocator local_6b8 [32];
  free_ptr<search> sch;
  stringstream __msg;
  undefined1 local_670 [96];
  bool local_610;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  uint32_t search_trained_nb_policies;
  string task_string;
  string interpolation_string;
  string metatask_string;
  string search_allowed_transitions;
  string neighbor_features_string;
  string local_3d0 [32];
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar26 = 0;
  scoped_calloc_or_throw<Search::search>();
  psVar2 = (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->priv;
  task_string._M_dataplus._M_p = (pointer)&task_string.field_2;
  task_string._M_string_length = 0;
  task_string.field_2._M_local_buf[0] = '\0';
  metatask_string._M_dataplus._M_p = (pointer)&metatask_string.field_2;
  metatask_string._M_string_length = 0;
  metatask_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&interpolation_string,"data",(allocator *)&__msg);
  neighbor_features_string._M_dataplus._M_p = (pointer)&neighbor_features_string.field_2;
  neighbor_features_string._M_string_length = 0;
  neighbor_features_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&rollout_string,"mix_per_state",(allocator *)&__msg);
  std::__cxx11::string::string((string *)&rollin_string,"mix_per_state",(allocator *)&__msg);
  search_allowed_transitions._M_dataplus._M_p = (pointer)&search_allowed_transitions.field_2;
  search_allowed_transitions._M_string_length = 0;
  search_allowed_transitions.field_2._M_local_buf[0] = '\0';
  psVar2->A = 1;
  std::__cxx11::string::string((string *)&local_f0,"Search options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"search",local_6d8);
  location = &psVar2->A;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_110,location);
  local_610 = true;
  std::__cxx11::string::string
            ((string *)&sStack_708,"Use learning to search, argument=maximum action id or 0 for LDF"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,(typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"search_task",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_130,&task_string);
  local_610 = true;
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "the search task (use \"--search_task list\" to get a list of available tasks)",
             local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_150,"search_metatask",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_150,&metatask_string);
  local_610 = true;
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,"search_interpolation",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_170,&interpolation_string);
  local_610 = true;
  std::__cxx11::string::string
            ((string *)&sStack_708,"at what level should interpolation happen? [*data|policy]",
             local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_190,"search_rollout",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_190,&rollout_string);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_1b0,"search_rollin",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_1b0,&rollin_string);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"search_passes_per_policy",local_6d8);
  location_00 = &psVar2->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_1d0,location_00);
  ptVar11 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)&__msg,1);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "number of passes per policy (only valid for search_interpolation=policy)",local_6b8);
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,ptVar11);
  local_6e8 = all;
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1f0,"search_beta",local_6d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_1f0,&psVar2->beta);
  ptVar12 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,0.5);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "interpolation rate for policies (only valid for search_interpolation=policy)",
             local_6b8);
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&new_options,ptVar12);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"search_alpha",local_6d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_210,&psVar2->alpha);
  ptVar12 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,1e-10);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",local_6b8);
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&new_options,ptVar12);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"search_total_nb_policies",local_6d8);
  location_01 = &psVar2->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_230,location_01);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&new_options,(typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"search_trained_nb_policies",local_6d8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_250,&search_trained_nb_policies);
  std::__cxx11::string::string
            ((string *)&sStack_708,"the number of trained policies in a file",local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&new_options,(typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_270,"search_allowed_transitions",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_270,&search_allowed_transitions);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "read file of allowed transitions [def: all transitions are allowed]",local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string((string *)&local_290,"search_subsample_time",local_6d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_290,&psVar2->subsample_timesteps);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&new_options,(typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"search_neighbor_features",local_6d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_2b0,&neighbor_features_string);
  local_610 = true;
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_2d0,"search_rollout_num_steps",local_6d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_2d0,&psVar2->rollout_num_steps);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,(typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string((string *)&local_2f0,"search_history_length",local_6d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_2f0,&psVar2->history_length);
  local_610 = true;
  ptVar11 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)&__msg,1);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "some tasks allow you to specify how much history their depend on; specify that here",
             local_6b8);
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,ptVar11);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,"search_no_caching",local_6d8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_310,&psVar2->no_caching);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"search_xv",local_6d8);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_330,&psVar2->xv);
  std::__cxx11::string::string
            ((string *)&sStack_708,"train two separate policies, alternating prediction/learning",
             local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string((string *)&local_350,"search_perturb_oracle",local_6d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_350,&psVar2->perturb_oracle);
  ptVar12 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,0.0);
  std::__cxx11::string::string
            ((string *)&sStack_708,"perturb the oracle on rollin with this probability",local_6b8);
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&new_options,ptVar12);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string((string *)&local_370,"search_linear_ordering",local_6d8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_370,&psVar2->linear_ordering);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "insist on generating examples in linear order (def: hoopla permutation)",local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"search_active_verify",local_6d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_390,&psVar2->active_csoaa_verify);
  std::__cxx11::string::string
            ((string *)&sStack_708,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&new_options,(typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"search_save_every_k_runs",local_6d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_3b0,&psVar2->save_every_k_runs);
  std::__cxx11::string::string((string *)&sStack_708,"save model every k runs",local_6b8);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,(typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&sStack_708);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_3b0);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"search_task",(allocator *)&sStack_708);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar9 == '\0') {
    plVar20 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_00220f6e;
  }
  search_initialize(local_6e8,
                    sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_Search::search_*,_false>._M_head_impl);
  parse_neighbor_features
            (&neighbor_features_string,
             sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_Search::search_*,_false>._M_head_impl);
  iVar9 = std::__cxx11::string::compare((char *)&interpolation_string);
  if (iVar9 == 0) {
    psVar2->allow_current_policy = true;
    psVar2->adaptive_beta = true;
    psVar2->passes_per_policy = local_6e8->numpasses;
    if (1 < psVar2->current_policy) {
      psVar2->current_policy = 1;
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&interpolation_string);
    if (iVar9 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_670,
                      "error: --search_interpolation must be \'data\' or \'policy\'");
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xac5,&local_50);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  iVar9 = std::__cxx11::string::compare((char *)&rollout_string);
  if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)&rollout_string), iVar9 == 0))
  {
    psVar2->rollout_method = POLICY;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&rollout_string);
    if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)&rollout_string), iVar9 == 0)
       ) {
      psVar2->rollout_method = ORACLE;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&rollout_string);
      if (iVar9 == 0) {
        psVar2->rollout_method = MIX_PER_STATE;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&rollout_string);
        if ((iVar9 == 0) ||
           (iVar9 = std::__cxx11::string::compare((char *)&rollout_string), iVar9 == 0)) {
          psVar2->rollout_method = MIX_PER_ROLL;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&rollout_string);
          if (iVar9 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
            std::operator<<((ostream *)local_670,
                            "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                           );
            pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar13,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                       ,0xad5,&local_70);
            __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          psVar2->rollout_method = NO_ROLLOUT;
          psVar2->no_caching = true;
        }
      }
    }
  }
  iVar9 = std::__cxx11::string::compare((char *)&rollin_string);
  RVar25 = POLICY;
  if ((iVar9 != 0) &&
     (iVar9 = std::__cxx11::string::compare((char *)&rollin_string), RVar25 = POLICY, iVar9 != 0)) {
    iVar9 = std::__cxx11::string::compare((char *)&rollin_string);
    RVar25 = ORACLE;
    if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&rollin_string), iVar9 != 0))
    {
      iVar9 = std::__cxx11::string::compare((char *)&rollin_string);
      if (iVar9 == 0) {
        RVar25 = MIX_PER_STATE;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&rollin_string);
        RVar25 = MIX_PER_ROLL;
        if ((iVar9 != 0) &&
           (iVar9 = std::__cxx11::string::compare((char *)&rollin_string), iVar9 != 0)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<((ostream *)local_670,
                          "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                         );
          pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar13,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xae0,&local_90);
          __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
    }
  }
  psVar2->rollin_method = RVar25;
  ppVar14 = calloc_or_throw<polylabel>();
  psVar2->allowed_actions_cache = ppVar14;
  std::__cxx11::string::string((string *)&__msg,"cb",(allocator *)&sStack_708);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  psVar2->cb_learner = SUB41(iVar9,0);
  if (SUB41(iVar9,0) == false) {
    ppuVar15 = &COST_SENSITIVE::cs_label;
  }
  else {
    ppuVar15 = &CB::cb_label;
  }
  (*(code *)*ppuVar15)(psVar2->allowed_actions_cache);
  (psVar2->learn_losses).cs.costs.end_array = (wclass *)0x0;
  (psVar2->learn_losses).cs.costs.erase_count = 0;
  (psVar2->learn_losses).cs.costs._begin = (wclass *)0x0;
  (psVar2->learn_losses).cs.costs._end = (wclass *)0x0;
  (psVar2->gte_label).cs.costs._begin = (wclass *)0x0;
  (psVar2->gte_label).cs.costs._end = (wclass *)0x0;
  (psVar2->gte_label).cs.costs.end_array = (wclass *)0x0;
  (psVar2->gte_label).cs.costs.erase_count = 0;
  ensure_param(&psVar2->beta,0.0,1.0,0.5,"warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(&psVar2->alpha,0.0,1.0,1e-10,
               "warning: search_alpha must be in (0,1); resetting to 1e-10");
  psVar2->num_calls_to_run = 0;
  uVar1 = psVar2->current_policy;
  uVar10 = uVar1;
  if (local_6e8->training == true) {
    fVar27 = ceilf((float)local_6e8->numpasses / (float)*location_00);
    uVar10 = (int)fVar27 + uVar1;
  }
  if ((*location_01 < uVar10) && (*location_01 = uVar10, uVar1 != 0)) {
    poVar16 = std::operator<<((ostream *)&std::cerr,
                              "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                             );
    std::endl<char,std::char_traits<char>>(poVar16);
  }
  pvVar23 = local_6e8;
  if ((local_6e8->training == false) && (psVar2->current_policy != 0)) {
    psVar2->current_policy = psVar2->current_policy - 1;
  }
  poVar3 = local_6e8->options;
  std::__cxx11::string::string((string *)&__msg,"search_trained_nb_policies",local_6d8);
  std::__cxx11::to_string(&sStack_708,psVar2->current_policy);
  (*poVar3->_vptr_options_i[6])(poVar3,&__msg,&sStack_708);
  std::__cxx11::string::~string((string *)&sStack_708);
  std::__cxx11::string::~string((string *)&__msg);
  poVar3 = pvVar23->options;
  std::__cxx11::string::string
            ((string *)&__msg,"search_trained_nb_policies",(allocator *)&sStack_708);
  ptVar17 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)&__msg);
  VW::config::typed_option<unsigned_int>::value(ptVar17,psVar2->current_policy);
  std::__cxx11::string::~string((string *)&__msg);
  poVar3 = pvVar23->options;
  std::__cxx11::string::string((string *)&__msg,"search_total_nb_policies",local_6d8);
  std::__cxx11::to_string(&sStack_708,*location_01);
  (*poVar3->_vptr_options_i[6])(poVar3,&__msg,&sStack_708);
  std::__cxx11::string::~string((string *)&sStack_708);
  std::__cxx11::string::~string((string *)&__msg);
  poVar3 = pvVar23->options;
  std::__cxx11::string::string((string *)&__msg,"search_total_nb_policies",(allocator *)&sStack_708)
  ;
  ptVar17 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)&__msg);
  VW::config::typed_option<unsigned_int>::value(ptVar17,*location_01);
  std::__cxx11::string::~string((string *)&__msg);
  iVar9 = std::__cxx11::string::compare((char *)&task_string);
  if (iVar9 == 0) {
    poVar16 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar16 = std::operator<<(poVar16,"available search tasks:");
    std::endl<char,std::char_traits<char>>(poVar16);
    for (ppuVar15 = &all_tasks; *ppuVar15 != (undefined *)0x0; ppuVar15 = ppuVar15 + 1) {
      poVar16 = std::operator<<((ostream *)&std::cerr,"  ");
      poVar16 = std::operator<<(poVar16,*(char **)*ppuVar15);
      std::endl<char,std::char_traits<char>>(poVar16);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0022126f:
    exit(0);
  }
  iVar9 = std::__cxx11::string::compare((char *)&metatask_string);
  if (iVar9 == 0) {
    poVar16 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar16 = std::operator<<(poVar16,"available search metatasks:");
    std::endl<char,std::char_traits<char>>(poVar16);
    for (ppuVar15 = &all_metatasks; *ppuVar15 != (undefined *)0x0; ppuVar15 = ppuVar15 + 1) {
      poVar16 = std::operator<<((ostream *)&std::cerr,"  ");
      poVar16 = std::operator<<(poVar16,*(char **)*ppuVar15);
      std::endl<char,std::char_traits<char>>(poVar16);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    goto LAB_0022126f;
  }
  for (ppuVar15 = &all_tasks; *ppuVar15 != (undefined *)0x0; ppuVar15 = ppuVar15 + 1) {
    iVar9 = std::__cxx11::string::compare((char *)&task_string);
    if (iVar9 == 0) {
      psVar4 = (search_task *)*ppuVar15;
      psVar2->task = psVar4;
      (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->task_name = psVar4->task_name;
      break;
    }
  }
  if (psVar2->task == (search_task *)0x0) {
    std::__cxx11::string::string((string *)&__msg,"help",(allocator *)&sStack_708);
    iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    pvVar23 = local_6e8;
    if ((char)iVar9 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar16 = std::operator<<((ostream *)local_670,"fail: unknown task for --search_task \'");
      poVar16 = std::operator<<(poVar16,(string *)&task_string);
      std::operator<<(poVar16,"\'; use --search_task list to get a list");
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xb35,&local_b0);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  psVar2->metatask = (search_metatask *)0x0;
  for (ppuVar15 = &all_metatasks; *ppuVar15 != (undefined *)0x0; ppuVar15 = ppuVar15 + 1) {
    iVar9 = std::__cxx11::string::compare((char *)&metatask_string);
    if (iVar9 == 0) {
      psVar5 = (search_metatask *)*ppuVar15;
      psVar2->metatask = psVar5;
      (sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_Search::search_*,_false>._M_head_impl)->metatask_name =
           psVar5->metatask_name;
      break;
    }
  }
  pvVar23->p->emptylines_separate_examples = true;
  std::__cxx11::string::string((string *)&__msg,"csoaa",&local_6d9);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  if ((char)iVar9 == '\0') {
    std::__cxx11::string::string((string *)&sStack_708,"cs_active",&local_6da);
    iVar9 = (*options->_vptr_options_i[1])(options,&sStack_708);
    if ((char)iVar9 != '\0') {
LAB_00220cf5:
      std::__cxx11::string::~string((string *)&sStack_708);
      goto LAB_00220cfd;
    }
    std::__cxx11::string::string((string *)local_6d8,"csoaa_ldf",&local_6db);
    iVar9 = (*options->_vptr_options_i[1])(options,local_6d8);
    if ((char)iVar9 != '\0') {
      std::__cxx11::string::~string((string *)local_6d8);
      goto LAB_00220cf5;
    }
    std::__cxx11::string::string((string *)local_6b8,"wap_ldf",&local_6dc);
    iVar9 = (*options->_vptr_options_i[1])(options,local_6b8);
    if ((char)iVar9 == '\0') {
      std::__cxx11::string::string(local_3d0,"cb",&local_6dd);
      iVar9 = (*options->_vptr_options_i[1])(options,local_3d0);
      bVar22 = (byte)iVar9 ^ 1;
      std::__cxx11::string::~string(local_3d0);
    }
    else {
      bVar22 = 0;
    }
    std::__cxx11::string::~string((string *)local_6b8);
    std::__cxx11::string::~string((string *)local_6d8);
    std::__cxx11::string::~string((string *)&sStack_708);
    std::__cxx11::string::~string((string *)&__msg);
    if (bVar22 != 0) {
      std::__cxx11::string::string((string *)&__msg,"csoaa",local_6d8);
      std::__cxx11::to_string(&sStack_708,*location);
      (*options->_vptr_options_i[5])(options,&__msg,&sStack_708);
      goto LAB_00220cf5;
    }
  }
  else {
LAB_00220cfd:
    std::__cxx11::string::~string((string *)&__msg);
  }
  std::__cxx11::string::string((string *)&__msg,"cs_active",(allocator *)&sStack_708);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  psVar2->active_csoaa = SUB41(iVar9,0);
  std::__cxx11::string::~string((string *)&__msg);
  psVar2->active_csoaa_verify = -1.0;
  std::__cxx11::string::string((string *)&__msg,"search_active_verify",(allocator *)&sStack_708);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  pvVar23 = local_6e8;
  if (((char)iVar9 != '\0') && (psVar2->active_csoaa == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_670,
                    "cannot use --search_active_verify without using --cs_active");
    pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar13,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xb4b,&local_d0);
    __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  base = setup_base(local_6e8->options,local_6e8);
  ppuVar15 = &MULTICLASS::mc_label;
  plVar24 = &pvVar23->p->lp;
  for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
    plVar24->default_label = (_func_void_void_ptr *)*ppuVar15;
    ppuVar15 = ppuVar15 + (ulong)bVar26 * -2 + 1;
    plVar24 = (label_parser *)((long)plVar24 + (ulong)bVar26 * -0x10 + 8);
  }
  pvVar23->label_type = mc;
  if ((psVar2->task != (search_task *)0x0) &&
     (p_Var6 = psVar2->task->initialize,
     p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
    (*p_Var6)(sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_Search::search_*,_false>._M_head_impl,location,options);
  }
  if ((psVar2->metatask != (search_metatask *)0x0) &&
     (p_Var6 = psVar2->metatask->initialize,
     p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
    (*p_Var6)(sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_Search::search_*,_false>._M_head_impl,location,options);
  }
  psVar2->meta_t = 0;
  std::__cxx11::string::string
            ((string *)&__msg,"search_allowed_transitions",(allocator *)&sStack_708);
  iVar9 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  pvVar23 = local_6e8;
  if ((char)iVar9 != '\0') {
    read_allowed_transitions
              ((v_array<COST_SENSITIVE::label> *)&__msg,(action)*location,
               search_allowed_transitions._M_dataplus._M_p);
  }
  handle_condition_options(pvVar23,&psVar2->acset);
  if (psVar2->allow_current_policy == false) {
    pvVar23->check_holdout_every_n_passes = *location_00;
  }
  pvVar23->searchstr =
       sch._M_t.super___uniq_ptr_impl<Search::search,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_Search::search_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_Search::search_*,_false>._M_head_impl;
  cVar18 = clock();
  psVar2->start_clock_time = cVar18;
  sVar19 = psVar2->num_learners;
  if (psVar2->xv == true) {
    sVar19 = sVar19 * 3;
    psVar2->num_learners = sVar19;
  }
  plVar20 = LEARNER::
            init_learner<Search::search,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,char>>
                      (&sch,base,do_actual_learning<true>,do_actual_learning<false>,
                       *location_01 * sVar19);
  uVar7 = *(undefined8 *)(plVar20 + 0x18);
  uVar8 = *(undefined8 *)(plVar20 + 0x20);
  *(undefined8 *)(plVar20 + 0x58) = uVar7;
  *(code **)(plVar20 + 0x68) = finish_multiline_example;
  *(undefined8 *)(plVar20 + 0xa0) = uVar7;
  *(undefined8 *)(plVar20 + 0xa8) = uVar8;
  *(code **)(plVar20 + 0xb0) = end_examples;
  *(undefined8 *)(plVar20 + 0xb8) = uVar7;
  *(undefined8 *)(plVar20 + 0xc0) = uVar8;
  *(code **)(plVar20 + 200) = search_finish;
  *(undefined8 *)(plVar20 + 0x88) = uVar7;
  *(undefined8 *)(plVar20 + 0x90) = uVar8;
  *(code **)(plVar20 + 0x98) = end_pass;
LAB_00220f6e:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&search_allowed_transitions);
  std::__cxx11::string::~string((string *)&rollin_string);
  std::__cxx11::string::~string((string *)&rollout_string);
  std::__cxx11::string::~string((string *)&neighbor_features_string);
  std::__cxx11::string::~string((string *)&interpolation_string);
  std::__cxx11::string::~string((string *)&metatask_string);
  std::__cxx11::string::~string((string *)&task_string);
  std::unique_ptr<Search::search,_void_(*)(void_*)>::~unique_ptr(&sch);
  return (base_learner *)plVar20;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("search_task"))
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = sch.get();

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}